

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestAds::testAdsNotification(TestAds *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  test_info *ptVar3;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  int *piVar10;
  string *test_case_name;
  string local_1078;
  AdsNotificationAttrib attrib;
  AmsAddr unknown;
  uint32_t notification [1024];
  
  lVar6 = AdsPortOpenEx();
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  test_case_name = (string *)notification;
  notification._0_8_ = notification + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)test_case_name,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar6 != 0,test_case_name,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x2cf);
  if ((uint32_t *)notification._0_8_ != notification + 4) {
    operator_delete((void *)notification._0_8_);
  }
  attrib.cbLength = 1;
  attrib.nTransMode = 3;
  attrib.nMaxDelay = 0;
  attrib.field_3 = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0xf4240;
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (0,&server,0x4020,0,&attrib,NotifyCallback,0xdeadbeef,(uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  paVar1 = &local_1078.field_2;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x748,&local_1078,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncAddDeviceNotificationReqEx(0, &server, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2da);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,(AmsAddr *)0x0,0x4020,0,&attrib,NotifyCallback,0xdeadbeef,
                     (uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x749,&local_1078,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncAddDeviceNotificationReqEx(port, nullptr, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2df);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,&unknown,0x4020,0,&attrib,NotifyCallback,0xdeadbeef,
                     (uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 7,&local_1078,
             "GLOBALERR_MISSING_ROUTE == AdsSyncAddDeviceNotificationReqEx(port, &unknown, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2e5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,&server,0,0,&attrib,NotifyCallback,0xdeadbeef,(uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x701,&local_1078,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncAddDeviceNotificationReqEx(port, &server, 0, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2ea);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,&server,0x4025,0x10000,&attrib,NotifyCallback,0xdeadbeef,
                     (uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x701,&local_1078,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4025, 0x10000, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,&server,0x4020,4,(AdsNotificationAttrib *)0x0,NotifyCallback,0xdeadbeef,
                     (uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x741,&local_1078,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, nullptr, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,&server,0x4020,4,&attrib,
                     (_func_void_AmsAddr_ptr_AdsNotificationHeader_ptr_uint *)0x0,0xdeadbeef,
                     (uint *)test_case_name);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x741,&local_1078,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, nullptr, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncAddDeviceNotificationReqEx
                    (lVar6,&server,0x4020,4,&attrib,NotifyCallback,0xdeadbeef,(uint *)0x0);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x741,&local_1078,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2fb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = AdsSyncDelDeviceNotificationReqEx(lVar6,&server,0xdeadbeef);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar7 == 0x752,&local_1078,
             "ADSERR_CLIENT_REMOVEHASH == AdsSyncDelDeviceNotificationReqEx(port, &server, 0xDEADBEEF)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2fe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != paVar1) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  lVar7 = 0;
  do {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar8 = AdsSyncAddDeviceNotificationReqEx
                      (lVar6,&server,0x4020,4,&attrib,NotifyCallback,(uint)lVar7,
                       (uint *)test_case_name);
    if ((lVar8 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hUser",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      bVar2 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
      local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar2,&local_1078,
                 "0 == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, &notification[hUser])"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x306);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
        operator_delete(local_1078._M_dataplus._M_p);
      }
    }
    lVar7 = lVar7 + 1;
    test_case_name = (string *)((long)&(test_case_name->_M_dataplus)._M_p + 4);
  } while (lVar7 != 0x400);
  local_1078._M_dataplus._M_p = (pointer)0x0;
  local_1078._M_string_length = 100000000;
  do {
    iVar5 = nanosleep((timespec *)&local_1078,(timespec *)&local_1078);
    if (iVar5 != -1) break;
    piVar10 = __errno_location();
  } while (*piVar10 == 4);
  lVar7 = 0;
  do {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar8 = AdsSyncDelDeviceNotificationReqEx(lVar6,&server,notification[lVar7]);
    if ((lVar8 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hUser",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      bVar2 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
      pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
      local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
      fructose::test_root::test_assert
                ((test_root *)this,bVar2,&local_1078,
                 "0 == AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser])",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x30a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
        operator_delete(local_1078._M_dataplus._M_p);
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x200);
  lVar6 = AdsPortCloseEx(lVar6);
  ptVar3 = (this->super_test_base<TestAds>).super_test_root.m_current_test_info;
  pcVar4 = (ptVar3->m_test_name)._M_dataplus._M_p;
  local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1078,pcVar4,pcVar4 + (ptVar3->m_test_name)._M_string_length);
  fructose::test_root::test_assert
            ((test_root *)this,lVar6 == 0,&local_1078,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x30c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  return;
}

Assistant:

void testAdsNotification(const std::string&)
    {
        const long port = AdsPortOpenEx();

        fructose_assert(0 != port);

        static const size_t MAX_NOTIFICATIONS_PER_PORT = 1024;
        static const size_t LEAKED_NOTIFICATIONS = MAX_NOTIFICATIONS_PER_PORT / 2;
        uint32_t notification[MAX_NOTIFICATIONS_PER_PORT];
        AdsNotificationAttrib attrib = { 1, ADSTRANS_SERVERCYCLE, 0, {1000000} };
        uint32_t hUser = 0xDEADBEEF;

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncAddDeviceNotificationReqEx(0, &server, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncAddDeviceNotificationReqEx(port, nullptr, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncAddDeviceNotificationReqEx(port, &unknown, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide invalid indexGroup
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide invalid indexOffset
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4025, 0x10000, &attrib, &NotifyCallback,
                                                          hUser,
                                                          &notification[0]));

        // provide nullptr to attrib/callback/hNotification
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, nullptr, &NotifyCallback, hUser,
                                                          &notification[0]));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, nullptr, hUser,
                                                          &notification[0]));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser,
                                                          nullptr));

        // delete nonexisting notification
        fructose_assert(ADSERR_CLIENT_REMOVEHASH == AdsSyncDelDeviceNotificationReqEx(port, &server, 0xDEADBEEF));

        // normal test
        for (hUser = 0; hUser < MAX_NOTIFICATIONS_PER_PORT; ++hUser) {
            fructose_loop_assert(hUser,
                                 0 ==
                                 AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback,
                                                                   hUser,
                                                                   &notification[hUser]));
        }
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        for (hUser = 0; hUser < MAX_NOTIFICATIONS_PER_PORT - LEAKED_NOTIFICATIONS; ++hUser) {
            fructose_loop_assert(hUser, 0 == AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser]));
        }
        fructose_assert(0 == AdsPortCloseEx(port));
    }